

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_wnaf_fixed(int *wnaf,secp256k1_scalar *s,int w)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar13;
  ulong uVar14;
  ulong uVar12;
  
  if (((s->d[1] == 0 && s->d[2] == 0) && s->d[3] == 0) && s->d[0] == 0) {
    uVar12 = (long)(w + 0x7f) / (long)w;
    if ((int)uVar12 < 1) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      memset(wnaf,0,(uVar12 & 0xffffffff) << 2);
    }
  }
  else {
    uVar11 = (uint)s->d[0];
    uVar6 = ~uVar11 & 1;
    bVar5 = (byte)w;
    *wnaf = (~(uint)(-1L << (bVar5 & 0x3f)) & uVar11) + uVar6;
    iVar3 = (w + 0x7f) / w;
    uVar11 = iVar3 - 1;
    uVar12 = (ulong)uVar11;
    iVar7 = 0x80 - uVar11 * w;
    uVar8 = (ulong)uVar11;
    uVar9 = (ulong)(uint)w;
    if (1 < iVar3) {
      uVar4 = uVar9 * uVar8;
      lVar13 = 0;
      uVar12 = uVar8;
      do {
        iVar3 = w;
        if (lVar13 == 0) {
          iVar3 = iVar7;
        }
        uVar14 = uVar4 >> 6 & 0x3ffffff;
        if ((iVar3 + (int)uVar4) - 1U >> 6 == (uint)uVar14) {
          uVar11 = (uint)(s->d[uVar14] >> ((byte)uVar4 & 0x3f));
        }
        else {
          bVar2 = (byte)uVar4 & 0x3f;
          uVar11 = (uint)(s->d[uVar14] >> bVar2) | (uint)(s->d[uVar14 + 1] << 0x40 - bVar2);
        }
        if ((uVar11 & ~(uint)(-1L << ((byte)iVar3 & 0x3f))) != 0) goto LAB_00164186;
        wnaf[uVar12] = 0;
        lVar13 = lVar13 + 1;
        uVar4 = uVar4 - uVar9;
        bVar1 = 1 < (long)uVar12;
        uVar12 = uVar12 - 1;
      } while (bVar1);
      uVar12 = 0;
    }
LAB_00164186:
    if (0 < (int)uVar12) {
      uVar14 = 1;
      uVar4 = uVar9;
      do {
        iVar3 = w;
        if (uVar8 == uVar14) {
          iVar3 = iVar7;
        }
        uVar10 = uVar4 >> 6 & 0x3ffffff;
        if (((int)uVar4 + iVar3) - 1U >> 6 == (uint)uVar10) {
          uVar10 = s->d[uVar10] >> ((byte)uVar4 & 0x3f);
        }
        else {
          bVar2 = (byte)uVar4 & 0x3f;
          uVar10 = s->d[uVar10] >> bVar2 | s->d[uVar10 + 1] << 0x40 - bVar2;
        }
        uVar10 = ~(-1L << ((byte)iVar3 & 0x3f)) & uVar10;
        uVar11 = (uint)uVar10;
        if ((uVar10 & 1) == 0) {
          wnaf[uVar14 - 1] = wnaf[uVar14 - 1] + (-1 << (bVar5 & 0x1f));
          uVar11 = uVar11 | 1;
        }
        wnaf[uVar14] = uVar11;
        if ((1 < uVar14) &&
           (((iVar3 = wnaf[uVar14 - 1], iVar3 == 1 && (wnaf[uVar14 - 2] < 0)) ||
            ((iVar3 == -1 && (0 < wnaf[uVar14 - 2])))))) {
          wnaf[uVar14 - 2] = wnaf[uVar14 - 2] + ((uint)(iVar3 == 1) * 2 + -1 << (bVar5 & 0x1f));
          wnaf[uVar14 - 1] = 0;
        }
        uVar14 = uVar14 + 1;
        uVar4 = uVar4 + uVar9;
      } while ((int)uVar12 + 1 != uVar14);
    }
  }
  return uVar6;
}

Assistant:

static int secp256k1_wnaf_fixed(int *wnaf, const secp256k1_scalar *s, int w) {
    int skew = 0;
    int pos;
    int max_pos;
    int last_w;
    const secp256k1_scalar *work = s;

    if (secp256k1_scalar_is_zero(s)) {
        for (pos = 0; pos < WNAF_SIZE(w); pos++) {
            wnaf[pos] = 0;
        }
        return 0;
    }

    if (secp256k1_scalar_is_even(s)) {
        skew = 1;
    }

    wnaf[0] = secp256k1_scalar_get_bits_var(work, 0, w) + skew;
    /* Compute last window size. Relevant when window size doesn't divide the
     * number of bits in the scalar */
    last_w = WNAF_BITS - (WNAF_SIZE(w) - 1) * w;

    /* Store the position of the first nonzero word in max_pos to allow
     * skipping leading zeros when calculating the wnaf. */
    for (pos = WNAF_SIZE(w) - 1; pos > 0; pos--) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if(val != 0) {
            break;
        }
        wnaf[pos] = 0;
    }
    max_pos = pos;
    pos = 1;

    while (pos <= max_pos) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if ((val & 1) == 0) {
            wnaf[pos - 1] -= (1 << w);
            wnaf[pos] = (val + 1);
        } else {
            wnaf[pos] = val;
        }
        /* Set a coefficient to zero if it is 1 or -1 and the proceeding digit
         * is strictly negative or strictly positive respectively. Only change
         * coefficients at previous positions because above code assumes that
         * wnaf[pos - 1] is odd.
         */
        if (pos >= 2 && ((wnaf[pos - 1] == 1 && wnaf[pos - 2] < 0) || (wnaf[pos - 1] == -1 && wnaf[pos - 2] > 0))) {
            if (wnaf[pos - 1] == 1) {
                wnaf[pos - 2] += 1 << w;
            } else {
                wnaf[pos - 2] -= 1 << w;
            }
            wnaf[pos - 1] = 0;
        }
        ++pos;
    }

    return skew;
}